

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

BSTR __thiscall CmdLineArgsParser::GetCurrentString(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  LPWSTR pWVar2;
  BSTR pWVar3;
  undefined8 *puVar4;
  OLECHAR local_418 [4];
  char16 buffer [512];
  
  memset(local_418,0,0x400);
  pWVar2 = this->pszCurrentArg;
  WVar1 = *pWVar2;
  if ((WVar1 == L'\0') || (WVar1 == L' ')) {
    this->pszCurrentArg = pWVar2 + 1;
    pWVar3 = (BSTR)0x0;
  }
  else {
    if (WVar1 != L':') {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = L"Expected \':\'";
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
    this->pszCurrentArg = pWVar2 + 1;
    ParseString(this,local_418,0x200,false);
    pWVar3 = SysAllocString(local_418);
  }
  return pWVar3;
}

Assistant:

BSTR
CmdLineArgsParser::GetCurrentString()
{
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    switch (CurChar())
    {
    case ':':
        NextChar();
        return SysAllocString(ParseString(buffer, MaxTokenSize, false));
    case ' ':
    case 0:
        NextChar();
        return nullptr;
    default:
        throw Exception(_u("Expected ':'"));
    }
}